

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_som.cxx
# Opt level: O2

void __thiscall xray_re::xr_level_som::load(xr_level_som *this,xr_reader *r)

{
  undefined1 auVar1 [16];
  uint __line;
  size_t sVar2;
  size_t n;
  som_poly *values;
  char *__assertion;
  uint32_t version;
  
  sVar2 = xr_reader::r_chunk<unsigned_int>(r,0,&version);
  if (sVar2 == 0) {
    __assertion = "0";
    __line = 0x10;
  }
  else if (version == 0) {
    sVar2 = xr_reader::find_chunk(r,1);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar2;
    n = SUB168(auVar1 / ZEXT816(0x2c),0);
    if ((sVar2 != 0) && (sVar2 % 0x2c == 0)) {
      values = (som_poly *)operator_new__(n * 0x2c);
      this->m_polys = values;
      xr_reader::r_cseq<xray_re::som_poly>(r,n,values);
      this->m_num_polys = SUB164(auVar1 / ZEXT816(0x2c),0);
      return;
    }
    __assertion = "size && (size % sizeof(som_poly) == 0)";
    __line = 0x14;
  }
  else {
    __assertion = "version == SOM_VERSION";
    __line = 0x11;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_som.cxx"
                ,__line,"void xray_re::xr_level_som::load(xr_reader &)");
}

Assistant:

void xr_level_som::load(xr_reader& r)
{
	uint32_t version;
	if (!r.r_chunk(SOM_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == SOM_VERSION);

	size_t size = r.find_chunk(SOM_CHUNK_POLYGONS);
	xr_assert(size && (size % sizeof(som_poly) == 0));
	m_polys = new som_poly[size /= sizeof(som_poly)];
	r.r_cseq(size, m_polys);
	m_num_polys = uint32_t(size & UINT32_MAX);
}